

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimdInt8x16OperationX86X64.cpp
# Opt level: O1

SIMDValue Js::SIMDInt8x16Operation::OpGreaterThanOrEqual(SIMDValue *aValue,SIMDValue *bValue)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  char cVar30;
  char cVar31;
  char cVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  
  cVar1 = (aValue->field_0).i8[0];
  cVar2 = (aValue->field_0).i8[1];
  cVar3 = (aValue->field_0).i8[2];
  cVar4 = (aValue->field_0).i8[3];
  cVar5 = (aValue->field_0).i8[4];
  cVar6 = (aValue->field_0).i8[5];
  cVar7 = (aValue->field_0).i8[6];
  cVar8 = (aValue->field_0).i8[7];
  cVar9 = (aValue->field_0).i8[8];
  cVar10 = (aValue->field_0).i8[9];
  cVar11 = (aValue->field_0).i8[10];
  cVar12 = (aValue->field_0).i8[0xb];
  cVar13 = (aValue->field_0).i8[0xc];
  cVar14 = (aValue->field_0).i8[0xd];
  cVar15 = (aValue->field_0).i8[0xe];
  cVar16 = (aValue->field_0).i8[0xf];
  cVar17 = (bValue->field_0).i8[0];
  cVar18 = (bValue->field_0).i8[1];
  cVar19 = (bValue->field_0).i8[2];
  cVar20 = (bValue->field_0).i8[3];
  cVar21 = (bValue->field_0).i8[4];
  cVar22 = (bValue->field_0).i8[5];
  cVar23 = (bValue->field_0).i8[6];
  cVar24 = (bValue->field_0).i8[7];
  cVar25 = (bValue->field_0).i8[8];
  cVar26 = (bValue->field_0).i8[9];
  cVar27 = (bValue->field_0).i8[10];
  cVar28 = (bValue->field_0).i8[0xb];
  cVar29 = (bValue->field_0).i8[0xc];
  cVar30 = (bValue->field_0).i8[0xd];
  cVar31 = (bValue->field_0).i8[0xe];
  cVar32 = (bValue->field_0).i8[0xf];
  AutoSystemInfo::SSE4_1Available(&AutoSystemInfo::Data);
  auVar34._8_4_ = 0xffffffff;
  auVar34._0_8_ = 0xffffffffffffffff;
  auVar34._12_4_ = 0xffffffff;
  auVar33[1] = -(cVar2 < cVar18);
  auVar33[0] = -(cVar1 < cVar17);
  auVar33[2] = -(cVar3 < cVar19);
  auVar33[3] = -(cVar4 < cVar20);
  auVar33[4] = -(cVar5 < cVar21);
  auVar33[5] = -(cVar6 < cVar22);
  auVar33[6] = -(cVar7 < cVar23);
  auVar33[7] = -(cVar8 < cVar24);
  auVar33[8] = -(cVar9 < cVar25);
  auVar33[9] = -(cVar10 < cVar26);
  auVar33[10] = -(cVar11 < cVar27);
  auVar33[0xb] = -(cVar12 < cVar28);
  auVar33[0xc] = -(cVar13 < cVar29);
  auVar33[0xd] = -(cVar14 < cVar30);
  auVar33[0xe] = -(cVar15 < cVar31);
  auVar33[0xf] = -(cVar16 < cVar32);
  return (SIMDValue)(anon_union_16_9_4d7543c8_for__SIMDValue_0)(auVar34 ^ auVar33);
}

Assistant:

SIMDValue SIMDInt8x16Operation::OpGreaterThanOrEqual(const SIMDValue& aValue, const SIMDValue& bValue)
    {
        X86SIMDValue x86Result;
        X86SIMDValue tmpaValue = X86SIMDValue::ToX86SIMDValue(aValue);
        X86SIMDValue tmpbValue = X86SIMDValue::ToX86SIMDValue(bValue);
        if (AutoSystemInfo::Data.SSE4_1Available())
        {
            x86Result.m128i_value = _mm_max_epi8(tmpaValue.m128i_value, tmpbValue.m128i_value);  //  max(a,b) == b
            x86Result.m128i_value = _mm_cmpeq_epi8(tmpaValue.m128i_value, x86Result.m128i_value); //
        }
        else
        {
            X86SIMDValue x86Tmp1, x86Tmp2;
            x86Tmp1.m128i_value = _mm_cmpgt_epi8(tmpaValue.m128i_value, tmpbValue.m128i_value); // compare a > b?
            x86Tmp2.m128i_value = _mm_cmpeq_epi8(tmpaValue.m128i_value, tmpbValue.m128i_value); // compare a == b?
            x86Result.m128i_value = _mm_or_si128(x86Tmp1.m128i_value, x86Tmp2.m128i_value);
        }


        return X86SIMDValue::ToSIMDValue(x86Result);
    }